

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O3

void __thiscall
sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode::CacheNode
          (CacheNode *this,pair<sjtu::orderType,_long> *value_,locType *offset_,
          LRUCache<std::pair<sjtu::orderType,_long>_> *bel_)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  char (*pacVar10) [41];
  char (*pacVar11) [41];
  value_type local_28;
  pair<sjtu::map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_18;
  
  uVar1 = *(undefined8 *)(value_->first).username;
  uVar2 = *(undefined8 *)((value_->first).username + 8);
  uVar3 = *(undefined8 *)((value_->first).username + 0x10);
  uVar4 = *(undefined8 *)((value_->first).trainID + 3);
  uVar5 = *(undefined8 *)((value_->first).trainID + 0xd);
  *(undefined8 *)((this->value).first.trainID + 5) = *(undefined8 *)((value_->first).trainID + 5);
  *(undefined8 *)((this->value).first.trainID + 0xd) = uVar5;
  *(undefined8 *)((this->value).first.username + 0x10) = uVar3;
  *(undefined8 *)((this->value).first.trainID + 3) = uVar4;
  *(undefined8 *)(this->value).first.username = uVar1;
  *(undefined8 *)((this->value).first.username + 8) = uVar2;
  iVar6 = (value_->first).date[0].day;
  iVar7 = (value_->first).date[0].hour;
  iVar8 = (value_->first).date[0].minute;
  (this->value).first.date[0].month = (value_->first).date[0].month;
  (this->value).first.date[0].day = iVar6;
  (this->value).first.date[0].hour = iVar7;
  (this->value).first.date[0].minute = iVar8;
  iVar6 = (value_->first).date[1].day;
  iVar7 = (value_->first).date[1].hour;
  iVar8 = (value_->first).date[1].minute;
  (this->value).first.date[1].month = (value_->first).date[1].month;
  (this->value).first.date[1].day = iVar6;
  (this->value).first.date[1].hour = iVar7;
  (this->value).first.date[1].minute = iVar8;
  pacVar10 = (value_->first).station;
  pacVar11 = (this->value).first.station;
  for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined4 *)*pacVar11 = *(undefined4 *)*pacVar10;
    pacVar10 = (char (*) [41])(*pacVar10 + 4);
    pacVar11 = (char (*) [41])(*pacVar11 + 4);
  }
  (this->value).second = value_->second;
  local_28.first = *offset_;
  this->offset = local_28.first;
  this->is_dirty_page = false;
  this->prec = (CacheNode *)0x0;
  this->succ = (CacheNode *)0x0;
  this->bel = bel_;
  local_28.second = this;
  map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::
  insert(&local_18,&bel_->table,&local_28);
  return;
}

Assistant:

CacheNode(const valueType &value_ , const locType &offset_ , LRUCache<valueType> *bel_) : value(value_) , offset(offset_) , bel(bel_) , is_dirty_page(false) , prec(nullptr) , succ(nullptr)
			{
				bel -> table.insert(std::make_pair(offset , this));
			}